

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

char * __thiscall cmTarget::GetLocation(cmTarget *this,string *config)

{
  int iVar1;
  string sStack_38;
  
  if (GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_);
    if (iVar1 != 0) {
      GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_.field_2;
      GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_._M_string_length = 0;
      GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_);
    }
  }
  if (this->IsImportedTarget == true) {
    ImportedGetFullPath(&sStack_38,this,config,false);
  }
  else {
    GetFullPath(&sStack_38,this,config,false,false);
  }
  std::__cxx11::string::operator=
            ((string *)&GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,
             (string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* cmTarget::GetLocation(const std::string& config) const
{
  static std::string location;
  if (this->IsImported())
    {
    location = this->ImportedGetFullPath(config, false);
    }
  else
    {
    location = this->GetFullPath(config, false);
    }
  return location.c_str();
}